

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.cpp
# Opt level: O0

bool __thiscall CHIP8::loadROM(CHIP8 *this,string *filename)

{
  byte bVar1;
  ostream *poVar2;
  streamoff sVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  int local_25c;
  int i;
  char *buffer;
  undefined8 local_248;
  int local_23c;
  undefined4 local_238;
  int length;
  string local_228 [8];
  ifstream in;
  string *filename_local;
  CHIP8 *this_local;
  
  std::ifstream::ifstream(local_228);
  poVar2 = std::operator<<((ostream *)&std::cerr,"Loading program: ");
  poVar2 = std::operator<<(poVar2,(string *)filename);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::operator|(_S_in,_S_bin);
  std::ifstream::open(local_228,(_Ios_Openmode)filename);
  bVar1 = std::ifstream::is_open();
  if ((bVar1 & 1) == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,"Program couldn\'t be opened!");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    this_local._7_1_ = false;
  }
  else {
    std::istream::seekg((long)local_228,_S_beg);
    auVar5 = std::istream::tellg();
    local_248 = auVar5._8_8_;
    buffer = auVar5._0_8_;
    sVar3 = std::fpos::operator_cast_to_long((fpos *)&buffer);
    local_23c = (int)sVar3;
    std::istream::seekg((long)local_228,_S_beg);
    poVar2 = std::operator<<((ostream *)&std::cerr,"\nProgram loaded : ");
    poVar2 = std::operator<<(poVar2,(string *)filename);
    poVar2 = std::operator<<(poVar2,"\nSize(bytes)    : ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_23c);
    poVar2 = std::operator<<(poVar2,"\n");
    std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
    pvVar4 = operator_new__((long)local_23c);
    std::istream::read((char *)local_228,(long)pvVar4);
    if (local_23c < 0xe00) {
      for (local_25c = 0; local_25c < local_23c; local_25c = local_25c + 1) {
        this->memory[local_25c + 0x200] = *(uchar *)((long)pvVar4 + (long)local_25c);
      }
      if (pvVar4 != (void *)0x0) {
        operator_delete__(pvVar4);
      }
      std::ifstream::close();
      this_local._7_1_ = true;
    }
    else {
      poVar2 = std::operator<<((ostream *)&std::cerr,"Program too big to fit in memory!");
      std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
      std::ifstream::close();
      this_local._7_1_ = false;
    }
  }
  local_238 = 1;
  std::ifstream::~ifstream(local_228);
  return this_local._7_1_;
}

Assistant:

bool CHIP8::loadROM(const std::string &filename){
    std::ifstream in;
    std::cerr << "Loading program: " << filename << std::endl;
    in.open(filename, std::ios::in | std::ios::binary);

    if(!in.is_open()){
        std::cerr << "Program couldn't be opened!" << std::endl;
        return false;
    }

    // get length of file:
    in.seekg (0, in.end);
    int length = in.tellg();
    in.seekg (0, in.beg);

    std::cerr << "\nProgram loaded : " << filename
              << "\nSize(bytes)    : " << length
              << "\n" << std::endl;

    char *buffer = new char[length];

    in.read(buffer, length);

    if (length < 4096 - 512){
        for (int i = 0; i < length; ++i){
            memory[512 + i] = buffer[i];
        }
    }
    else{
        std::cerr << "Program too big to fit in memory!" << std::endl;
        in.close();
        return false;
    }

    delete[] buffer;
    in.close();
    return true;
}